

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::FullClassName<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *desc,bool is_descriptor)

{
  bool bVar1;
  Descriptor *pDVar2;
  string classname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&classname,*(string **)desc);
  pDVar2 = desc;
  while (pDVar2 = *(Descriptor **)(pDVar2 + 0x18), pDVar2 != (Descriptor *)0x0) {
    std::operator+(&local_70,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pDVar2,'_'
                  );
    std::operator+(&local_50,&local_70,&classname);
    std::__cxx11::string::operator=((string *)&classname,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  ClassNamePrefix<google::protobuf::Descriptor>(&local_70,&classname,desc);
  std::operator+(&local_50,&local_70,&classname);
  std::__cxx11::string::operator=((string *)&classname,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           (*(long *)(desc + 0x10) + 8),"");
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)classname._M_dataplus._M_p == &classname.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(classname.field_2._M_allocated_capacity._1_7_,classname.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = classname.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = classname._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(classname.field_2._M_allocated_capacity._1_7_,classname.field_2._M_local_buf[0])
      ;
    }
    __return_storage_ptr__->_M_string_length = classname._M_string_length;
    classname._M_string_length = 0;
    classname.field_2._M_local_buf[0] = '\0';
    classname._M_dataplus._M_p = (pointer)&classname.field_2;
  }
  else {
    PhpName(&local_70,*(string **)(*(long *)(desc + 0x10) + 8),is_descriptor);
    std::operator+(&local_50,&local_70,'\\');
    std::operator+(__return_storage_ptr__,&local_50,&classname);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&classname);
  return __return_storage_ptr__;
}

Assistant:

std::string FullClassName(const DescriptorType* desc, bool is_descriptor) {
  string classname = desc->name();
  const Descriptor* containing = desc->containing_type();
  while (containing != NULL) {
    classname = containing->name() + '_' + classname;
    containing = containing->containing_type();
  }
  classname = ClassNamePrefix(classname, desc) + classname;

  if (desc->file()->package() == "") {
    return classname;
  } else {
    return PhpName(desc->file()->package(), is_descriptor) + '\\' +
           classname;
  }
}